

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value.c
# Opt level: O1

value value_create(void *data,size_t bytes)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *__dest;
  
  puVar1 = (undefined8 *)malloc(bytes + 0x28);
  if (puVar1 == (undefined8 *)0x0) {
    __dest = (undefined8 *)0x0;
  }
  else {
    *puVar1 = "value_impl_magic_alloc";
    puVar1[1] = bytes;
    puVar1[2] = 1;
    __dest = puVar1 + 5;
    puVar1[3] = 0;
    puVar1[4] = 0;
  }
  if (__dest != (undefined8 *)0x0) {
    pvVar2 = memcpy(__dest,data,bytes);
    return pvVar2;
  }
  return (value)0x0;
}

Assistant:

value value_create(const void *data, size_t bytes)
{
	value v = value_alloc(bytes);

	if (v == NULL)
	{
		return NULL;
	}

	memcpy(v, data, bytes);

	return v;
}